

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

int i2c_ASN1_INTEGER(ASN1_INTEGER *a,uchar **pp)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  size_t sVar5;
  void *dst;
  bool bVar6;
  byte local_5b;
  byte local_5a;
  byte local_51;
  int len;
  uint8_t msb;
  CBS copy;
  size_t pad;
  undefined1 auStack_30 [4];
  int is_negative;
  CBS cbs;
  uchar **outp_local;
  ASN1_INTEGER *in_local;
  
  if (a == (ASN1_INTEGER *)0x0) {
    in_local._4_4_ = 0;
  }
  else {
    cbs.len = (size_t)pp;
    CBS_init((CBS *)auStack_30,a->data,(long)a->length);
    while( true ) {
      sVar3 = CBS_len((CBS *)auStack_30);
      bVar6 = false;
      if (sVar3 != 0) {
        puVar4 = CBS_data((CBS *)auStack_30);
        bVar6 = *puVar4 == '\0';
      }
      if (!bVar6) break;
      CBS_skip((CBS *)auStack_30,1);
    }
    bVar6 = (a->type & 0x100U) != 0;
    _len = _auStack_30;
    copy.data = cbs.data;
    iVar2 = CBS_get_u8((CBS *)&len,&local_51);
    if (iVar2 == 0) {
      bVar6 = false;
      copy.len = 1;
    }
    else {
      if (bVar6) {
        local_5a = 1;
        if (local_51 < 0x81) {
          local_5b = 0;
          if (local_51 == 0x80) {
            puVar4 = CBS_data((CBS *)&len);
            sVar3 = CBS_len((CBS *)&len);
            iVar2 = is_all_zeros(puVar4,sVar3);
            local_5b = iVar2 != 0 ^ 0xff;
          }
          local_5a = local_5b;
        }
        bVar1 = (bool)(local_5a & 1);
      }
      else {
        bVar1 = (local_51 & 0x80) != 0;
      }
      copy.len = (size_t)bVar1;
    }
    sVar5 = CBS_len((CBS *)auStack_30);
    sVar3 = copy.len;
    if (0x7fffffff - copy.len < sVar5) {
      ERR_put_error(0xc,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0x7e);
      in_local._4_4_ = 0;
    }
    else {
      sVar5 = CBS_len((CBS *)auStack_30);
      in_local._4_4_ = (int)sVar3 + (int)sVar5;
      if (in_local._4_4_ < 1) {
        __assert_fail("len > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                      ,0x82,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
      }
      if (cbs.len != 0) {
        if (copy.len != 0) {
          **(undefined1 **)cbs.len = 0;
        }
        dst = (void *)(*(long *)cbs.len + copy.len);
        puVar4 = CBS_data((CBS *)auStack_30);
        sVar3 = CBS_len((CBS *)auStack_30);
        OPENSSL_memcpy(dst,puVar4,sVar3);
        if (bVar6) {
          negate_twos_complement(*(uint8_t **)cbs.len,(long)in_local._4_4_);
          if (**(byte **)cbs.len < 0x80) {
            __assert_fail("(*outp)[0] >= 0x80",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                          ,0x8d,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
          }
        }
        else if (0x7f < **(byte **)cbs.len) {
          __assert_fail("(*outp)[0] < 0x80",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                        ,0x8f,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
        }
        *(long *)cbs.len = *(long *)cbs.len + (long)in_local._4_4_;
      }
    }
  }
  return in_local._4_4_;
}

Assistant:

int i2c_ASN1_INTEGER(const ASN1_INTEGER *in, unsigned char **outp) {
  if (in == NULL) {
    return 0;
  }

  // |ASN1_INTEGER|s should be represented minimally, but it is possible to
  // construct invalid ones. Skip leading zeros so this does not produce an
  // invalid encoding or break invariants.
  CBS cbs;
  CBS_init(&cbs, in->data, in->length);
  while (CBS_len(&cbs) > 0 && CBS_data(&cbs)[0] == 0) {
    CBS_skip(&cbs, 1);
  }

  int is_negative = (in->type & V_ASN1_NEG) != 0;
  size_t pad;
  CBS copy = cbs;
  uint8_t msb;
  if (!CBS_get_u8(&copy, &msb)) {
    // Zero is represented as a single byte.
    is_negative = 0;
    pad = 1;
  } else if (is_negative) {
    // 0x80...01 through 0xff...ff have a two's complement of 0x7f...ff
    // through 0x00...01 and need an extra byte to be negative.
    // 0x01...00 through 0x80...00 have a two's complement of 0xfe...ff
    // through 0x80...00 and can be negated as-is.
    pad = msb > 0x80 ||
          (msb == 0x80 && !is_all_zeros(CBS_data(&copy), CBS_len(&copy)));
  } else {
    // If the high bit is set, the signed representation needs an extra
    // byte to be positive.
    pad = (msb & 0x80) != 0;
  }

  if (CBS_len(&cbs) > INT_MAX - pad) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }
  int len = (int)(pad + CBS_len(&cbs));
  assert(len > 0);
  if (outp == NULL) {
    return len;
  }

  if (pad) {
    (*outp)[0] = 0;
  }
  OPENSSL_memcpy(*outp + pad, CBS_data(&cbs), CBS_len(&cbs));
  if (is_negative) {
    negate_twos_complement(*outp, len);
    assert((*outp)[0] >= 0x80);
  } else {
    assert((*outp)[0] < 0x80);
  }
  *outp += len;
  return len;
}